

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_encoder.cc
# Opt level: O0

bool prometheus::detail::anon_unknown_1::needsEncoding(char c)

{
  undefined1 local_9;
  char c_local;
  
  if ((c < 'a') || ('z' < c)) {
    if ((c < 'A') || ('Z' < c)) {
      if ((c < '0') || ('9' < c)) {
        if ((c == '-') || (((c == '.' || (c == '_')) || (c == '~')))) {
          local_9 = false;
        }
        else {
          local_9 = true;
        }
      }
      else {
        local_9 = false;
      }
    }
    else {
      local_9 = false;
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool needsEncoding(char c) {
  if (c >= 'a' && c <= 'z') {
    return false;
  }
  if (c >= 'A' && c <= 'Z') {
    return false;
  }
  if (c >= '0' && c <= '9') {
    return false;
  }
  if (c == '-' || c == '.' || c == '_' || c == '~') {
    return false;
  }
  return true;
}